

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_compress_IDAT(png_structrp png_ptr,png_const_bytep input,png_alloc_size_t input_len,
                      int flush)

{
  uint uVar1;
  uInt uVar2;
  uInt uVar3;
  png_compression_buffer *ppVar4;
  int iVar5;
  png_compression_bufferp ppVar6;
  png_alloc_size_t pVar7;
  ulong uVar8;
  png_compression_buffer *ptr;
  char *error_message;
  png_byte *ppVar9;
  
  if (png_ptr->zowner != 0x49444154) {
    ppVar6 = png_ptr->zbuffer_list;
    if (ppVar6 == (png_compression_bufferp)0x0) {
      ppVar6 = (png_compression_bufferp)png_malloc(png_ptr,(ulong)png_ptr->zbuffer_size + 8);
      png_ptr->zbuffer_list = ppVar6;
      ppVar6->next = (png_compression_buffer *)0x0;
    }
    else {
      ptr = ppVar6->next;
      if (ptr != (png_compression_buffer *)0x0) {
        ppVar6->next = (png_compression_buffer *)0x0;
        do {
          ppVar4 = ptr->next;
          png_free(png_ptr,ptr);
          ptr = ppVar4;
        } while (ppVar4 != (png_compression_buffer *)0x0);
      }
    }
    pVar7 = png_image_size(png_ptr);
    iVar5 = png_deflate_claim(png_ptr,0x49444154,pVar7);
    if (iVar5 != 0) {
LAB_00121bdf:
      error_message = (png_ptr->zstream).msg;
      goto LAB_00121bef;
    }
    (png_ptr->zstream).next_out = png_ptr->zbuffer_list->output;
    (png_ptr->zstream).avail_out = png_ptr->zbuffer_size;
  }
  (png_ptr->zstream).next_in = input;
  (png_ptr->zstream).avail_in = 0;
LAB_00121a52:
  do {
    uVar8 = 0xffffffff;
    if (input_len < 0xffffffff) {
      uVar8 = input_len;
    }
    (png_ptr->zstream).avail_in = (uint32_t)uVar8;
    iVar5 = flush;
    if (input_len >> 0x20 != 0) {
      iVar5 = 0;
    }
    iVar5 = deflate(&png_ptr->zstream,iVar5);
    input_len = (ulong)(png_ptr->zstream).avail_in + (input_len - uVar8);
    (png_ptr->zstream).avail_in = 0;
    if ((png_ptr->zstream).avail_out == 0) {
      ppVar9 = png_ptr->zbuffer_list->output;
      uVar1 = png_ptr->zbuffer_size;
      if (((png_ptr->mode & 4) == 0) && (png_ptr->compression_type == '\0')) {
        pVar7 = png_image_size(png_ptr);
        optimize_cmf(ppVar9,pVar7);
      }
      if (uVar1 != 0) {
        png_write_complete_chunk(png_ptr,0x49444154,ppVar9,(ulong)uVar1);
      }
      *(byte *)&png_ptr->mode = (byte)png_ptr->mode | 4;
      (png_ptr->zstream).next_out = ppVar9;
      (png_ptr->zstream).avail_out = uVar1;
      if ((flush != 0) && (iVar5 == 0)) goto LAB_00121a52;
    }
    if (iVar5 != 0) {
      if ((flush == 4) && (iVar5 == 1)) {
        ppVar9 = png_ptr->zbuffer_list->output;
        uVar2 = png_ptr->zbuffer_size;
        uVar3 = (png_ptr->zstream).avail_out;
        if (((png_ptr->mode & 4) == 0) && (png_ptr->compression_type == '\0')) {
          pVar7 = png_image_size(png_ptr);
          optimize_cmf(ppVar9,pVar7);
        }
        if (uVar2 != uVar3) {
          png_write_complete_chunk(png_ptr,0x49444154,ppVar9,(ulong)(uVar2 - uVar3));
        }
        (png_ptr->zstream).avail_out = 0;
        (png_ptr->zstream).next_out = (uchar *)0x0;
        *(byte *)&png_ptr->mode = (byte)png_ptr->mode | 0xc;
        png_ptr->zowner = 0;
        return;
      }
      png_zstream_error(png_ptr,iVar5);
      goto LAB_00121bdf;
    }
  } while (input_len != 0);
  if (flush != 4) {
    return;
  }
  error_message = "Z_OK on Z_FINISH with output space";
LAB_00121bef:
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_compress_IDAT(png_structrp png_ptr, png_const_bytep input,
    png_alloc_size_t input_len, int flush)
{
   if (png_ptr->zowner != png_IDAT)
   {
      /* First time.   Ensure we have a temporary buffer for compression and
       * trim the buffer list if it has more than one entry to free memory.
       * If 'WRITE_COMPRESSED_TEXT' is not set the list will never have been
       * created at this point, but the check here is quick and safe.
       */
      if (png_ptr->zbuffer_list == NULL)
      {
         png_ptr->zbuffer_list = png_voidcast(png_compression_bufferp,
             png_malloc(png_ptr, PNG_COMPRESSION_BUFFER_SIZE(png_ptr)));
         png_ptr->zbuffer_list->next = NULL;
      }

      else
         png_free_buffer_list(png_ptr, &png_ptr->zbuffer_list->next);

      /* It is a terminal error if we can't claim the zstream. */
      if (png_deflate_claim(png_ptr, png_IDAT, png_image_size(png_ptr)) != Z_OK)
         png_error(png_ptr, png_ptr->zstream.msg);

      /* The output state is maintained in png_ptr->zstream, so it must be
       * initialized here after the claim.
       */
      png_ptr->zstream.next_out = png_ptr->zbuffer_list->output;
      png_ptr->zstream.avail_out = png_ptr->zbuffer_size;
   }

   /* Now loop reading and writing until all the input is consumed or an error
    * terminates the operation.  The _out values are maintained across calls to
    * this function, but the input must be reset each time.
    */
   png_ptr->zstream.next_in = PNGZ_INPUT_CAST(input);
   png_ptr->zstream.avail_in = 0; /* set below */
   for (;;)
   {
      int ret;

      /* INPUT: from the row data */
      uInt avail = ZLIB_IO_MAX;

      if (avail > input_len)
         avail = (uInt)input_len; /* safe because of the check */

      png_ptr->zstream.avail_in = avail;
      input_len -= avail;

      ret = deflate(&png_ptr->zstream, input_len > 0 ? Z_NO_FLUSH : flush);

      /* Include as-yet unconsumed input */
      input_len += png_ptr->zstream.avail_in;
      png_ptr->zstream.avail_in = 0;

      /* OUTPUT: write complete IDAT chunks when avail_out drops to zero. Note
       * that these two zstream fields are preserved across the calls, therefore
       * there is no need to set these up on entry to the loop.
       */
      if (png_ptr->zstream.avail_out == 0)
      {
         png_bytep data = png_ptr->zbuffer_list->output;
         uInt size = png_ptr->zbuffer_size;

         /* Write an IDAT containing the data then reset the buffer.  The
          * first IDAT may need deflate header optimization.
          */
#ifdef PNG_WRITE_OPTIMIZE_CMF_SUPPORTED
            if ((png_ptr->mode & PNG_HAVE_IDAT) == 0 &&
                png_ptr->compression_type == PNG_COMPRESSION_TYPE_BASE)
               optimize_cmf(data, png_image_size(png_ptr));
#endif

         if (size > 0)
            png_write_complete_chunk(png_ptr, png_IDAT, data, size);
         png_ptr->mode |= PNG_HAVE_IDAT;

         png_ptr->zstream.next_out = data;
         png_ptr->zstream.avail_out = size;

         /* For SYNC_FLUSH or FINISH it is essential to keep calling zlib with
          * the same flush parameter until it has finished output, for NO_FLUSH
          * it doesn't matter.
          */
         if (ret == Z_OK && flush != Z_NO_FLUSH)
            continue;
      }

      /* The order of these checks doesn't matter much; it just affects which
       * possible error might be detected if multiple things go wrong at once.
       */
      if (ret == Z_OK) /* most likely return code! */
      {
         /* If all the input has been consumed then just return.  If Z_FINISH
          * was used as the flush parameter something has gone wrong if we get
          * here.
          */
         if (input_len == 0)
         {
            if (flush == Z_FINISH)
               png_error(png_ptr, "Z_OK on Z_FINISH with output space");

            return;
         }
      }

      else if (ret == Z_STREAM_END && flush == Z_FINISH)
      {
         /* This is the end of the IDAT data; any pending output must be
          * flushed.  For small PNG files we may still be at the beginning.
          */
         png_bytep data = png_ptr->zbuffer_list->output;
         uInt size = png_ptr->zbuffer_size - png_ptr->zstream.avail_out;

#ifdef PNG_WRITE_OPTIMIZE_CMF_SUPPORTED
         if ((png_ptr->mode & PNG_HAVE_IDAT) == 0 &&
             png_ptr->compression_type == PNG_COMPRESSION_TYPE_BASE)
            optimize_cmf(data, png_image_size(png_ptr));
#endif

         if (size > 0)
            png_write_complete_chunk(png_ptr, png_IDAT, data, size);
         png_ptr->zstream.avail_out = 0;
         png_ptr->zstream.next_out = NULL;
         png_ptr->mode |= PNG_HAVE_IDAT | PNG_AFTER_IDAT;

         png_ptr->zowner = 0; /* Release the stream */
         return;
      }

      else
      {
         /* This is an error condition. */
         png_zstream_error(png_ptr, ret);
         png_error(png_ptr, png_ptr->zstream.msg);
      }
   }
}